

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void __thiscall
DLevelScript::DoSetActorProperty(DLevelScript *this,AActor *actor,int property,int value)

{
  bool bVar1;
  AActor *pAVar2;
  VMScriptFunction *pVVar3;
  AActor *pAVar4;
  char *pcVar5;
  AActor **ppAVar6;
  double dVar7;
  AActor *other;
  Self local_40;
  Self local_3c;
  Self local_38;
  Self local_34;
  Self local_30;
  Self local_2c;
  Self local_28;
  ERenderStyle local_24;
  int local_20;
  int i;
  int value_local;
  int property_local;
  AActor *actor_local;
  DLevelScript *this_local;
  
  if (actor != (AActor *)0x0) {
    local_20 = value;
    i = property;
    _value_local = actor;
    actor_local = (AActor *)this;
    switch(property) {
    case 0:
      if ((0 < actor->health) &&
         ((actor->player == (player_t *)0x0 || (actor->player->playerstate != '\x01')))) {
        actor->health = value;
        if (actor->player != (player_t *)0x0) {
          actor->player->health = value;
        }
        if (value < 1) {
          pAVar4 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->activator);
          pAVar2 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->activator);
          (*(actor->super_DThinker).super_DObject._vptr_DObject[0xf])(actor,pAVar4,pAVar2,0);
        }
      }
      break;
    case 1:
      dVar7 = ACSToDouble(value);
      _value_local->Speed = dVar7;
      break;
    case 2:
      pVVar3 = CreateDamageFunction(value);
      _value_local->Damage = &pVVar3->super_VMFunction;
      break;
    case 3:
      dVar7 = ACSToDouble(value);
      _value_local->Alpha = dVar7;
      break;
    case 4:
      for (local_24 = STYLE_None; -1 < LegacyRenderStyleIndices[(int)local_24];
          local_24 = local_24 + STYLE_Normal) {
        if (LegacyRenderStyleIndices[(int)local_24] == value) {
          FRenderStyle::operator=((FRenderStyle *)&(actor->RenderStyle).field_0,local_24);
          return;
        }
      }
      break;
    case 5:
      pcVar5 = FBehavior::StaticLookupString(value);
      FSoundIDNoInit::operator=(&_value_local->SeeSound,pcVar5);
      break;
    case 6:
      pcVar5 = FBehavior::StaticLookupString(value);
      FSoundIDNoInit::operator=(&_value_local->AttackSound,pcVar5);
      break;
    case 7:
      pcVar5 = FBehavior::StaticLookupString(value);
      FSoundIDNoInit::operator=(&_value_local->PainSound,pcVar5);
      break;
    case 8:
      pcVar5 = FBehavior::StaticLookupString(value);
      FSoundIDNoInit::operator=(&_value_local->DeathSound,pcVar5);
      break;
    case 9:
      pcVar5 = FBehavior::StaticLookupString(value);
      FSoundIDNoInit::operator=(&_value_local->ActiveSound,pcVar5);
      break;
    case 10:
      if (value == 0) {
        operator~((EnumType)&local_28);
        TFlags<ActorFlag,_unsigned_int>::operator&=(&_value_local->flags,&local_28);
      }
      else {
        TFlags<ActorFlag,_unsigned_int>::operator|=(&actor->flags,MF_AMBUSH);
      }
      break;
    case 0xb:
      if (value == 0) {
        operator~((EnumType)&local_30);
        TFlags<ActorFlag2,_unsigned_int>::operator&=(&_value_local->flags2,&local_30);
      }
      else {
        TFlags<ActorFlag2,_unsigned_int>::operator|=(&actor->flags2,MF2_INVULNERABLE);
      }
      break;
    case 0xc:
      bVar1 = DObject::IsKindOf((DObject *)actor,APlayerPawn::RegistrationInfo.MyClass);
      if (bVar1) {
        dVar7 = ACSToDouble(local_20);
        *(double *)&_value_local[1].super_DThinker.super_DObject.ObjectFlags = dVar7;
      }
      break;
    case 0xd:
      if (value == 0) {
        operator~((EnumType)&local_3c);
        TFlags<ActorFlag5,_unsigned_int>::operator&=(&_value_local->flags5,&local_3c);
      }
      else {
        TFlags<ActorFlag5,_unsigned_int>::operator|=(&actor->flags5,MF5_CHASEGOAL);
      }
      break;
    case 0xe:
      if (value == 0) {
        operator~((EnumType)&local_40);
        TFlags<ActorFlag4,_unsigned_int>::operator&=(&_value_local->flags4,&local_40);
      }
      else {
        TFlags<ActorFlag4,_unsigned_int>::operator|=(&actor->flags4,MF4_FRIGHTENED);
      }
      break;
    case 0xf:
      dVar7 = ACSToDouble(value);
      _value_local->Gravity = dVar7;
      break;
    case 0x10:
      bVar1 = AActor::CountsAsKill(actor);
      if (bVar1) {
        ::level.total_monsters = ::level.total_monsters + -1;
      }
      if (local_20 == 0) {
        operator~((int)&other + MF_SHOOTABLE);
        TFlags<ActorFlag,_unsigned_int>::operator&=(&_value_local->flags,(Self *)((long)&other + 4))
        ;
      }
      else {
        TFlags<ActorFlag,_unsigned_int>::operator|=(&_value_local->flags,MF_FRIENDLY);
      }
      bVar1 = AActor::CountsAsKill(_value_local);
      if (bVar1) {
        ::level.total_monsters = ::level.total_monsters + 1;
      }
      break;
    case 0x11:
      bVar1 = DObject::IsKindOf((DObject *)actor,APlayerPawn::RegistrationInfo.MyClass);
      if (bVar1) {
        *(int *)&_value_local[1].super_DThinker.super_DObject._vptr_DObject = local_20;
      }
      break;
    case 0x12:
      if (value == 0) {
        operator~((EnumType)&local_2c);
        TFlags<ActorFlag,_unsigned_int>::operator&=(&_value_local->flags,&local_2c);
      }
      else {
        TFlags<ActorFlag,_unsigned_int>::operator|=(&actor->flags,MF_DROPPED);
      }
      break;
    case 0x13:
      if (value == 0) {
        operator~((EnumType)&local_34);
        TFlags<ActorFlag3,_unsigned_int>::operator&=(&_value_local->flags3,&local_34);
      }
      else {
        TFlags<ActorFlag3,_unsigned_int>::operator|=(&actor->flags3,MF3_NOTARGET);
      }
      break;
    case 0x14:
      pcVar5 = FBehavior::StaticLookupString(value);
      FNameNoInit::operator=(&_value_local->Species,pcVar5);
      break;
    case 0x15:
      pcVar5 = FBehavior::StaticLookupString(value);
      AActor::SetTag(actor,pcVar5);
      break;
    case 0x16:
      actor->Score = value;
      break;
    case 0x17:
      if (value == 0) {
        operator~((EnumType)&local_38);
        TFlags<ActorFlag6,_unsigned_int>::operator&=(&_value_local->flags6,&local_38);
      }
      else {
        TFlags<ActorFlag6,_unsigned_int>::operator|=(&actor->flags6,MF6_NOTRIGGER);
      }
      break;
    case 0x18:
      dVar7 = ACSToDouble(value);
      _value_local->DamageFactor = dVar7;
      break;
    case 0x19:
      pAVar4 = SingleActorFromTID(value,(AActor *)0x0);
      DoSetMaster(_value_local,pAVar4);
      break;
    default:
      break;
    case 0x1d:
      dVar7 = ACSToDouble(value);
      (_value_local->Scale).X = dVar7;
      break;
    case 0x1e:
      dVar7 = ACSToDouble(value);
      (_value_local->Scale).Y = dVar7;
      break;
    case 0x20:
      actor->Mass = value;
      break;
    case 0x21:
      actor->accuracy = value;
      break;
    case 0x22:
      actor->stamina = value;
      break;
    case 0x25:
      actor->reactiontime = value;
      break;
    case 0x26:
      dVar7 = ACSToDouble(value);
      _value_local->meleerange = dVar7;
      break;
    case 0x27:
      bVar1 = DObject::IsKindOf((DObject *)actor,APlayerPawn::RegistrationInfo.MyClass);
      if (bVar1) {
        ppAVar6 = (AActor **)ACSToDouble(local_20);
        _value_local[1].sprev = ppAVar6;
        if (_value_local->player != (player_t *)0x0) {
          dVar7 = ACSToDouble(local_20);
          _value_local->player->viewheight = dVar7;
        }
      }
      break;
    case 0x28:
      bVar1 = DObject::IsKindOf((DObject *)actor,APlayerPawn::RegistrationInfo.MyClass);
      if (bVar1) {
        dVar7 = ACSToDouble(local_20);
        _value_local[1].SpriteAngle.Degrees = dVar7;
      }
      break;
    case 0x29:
      AActor::SetShade(actor,value);
      break;
    case 0x2a:
      dVar7 = ACSToDouble(value);
      _value_local->Friction = dVar7;
      break;
    case 0x2b:
      dVar7 = ACSToDouble(value);
      _value_local->DamageMultiply = dVar7;
      break;
    case 0x2c:
      dVar7 = ACSToDouble(value);
      _value_local->MaxStepHeight = dVar7;
      break;
    case 0x2d:
      dVar7 = ACSToDouble(value);
      _value_local->MaxDropOffHeight = dVar7;
      break;
    case 0x2e:
      pcVar5 = FBehavior::StaticLookupString(value);
      FNameNoInit::operator=(&_value_local->DamageType,pcVar5);
    }
  }
  return;
}

Assistant:

void DLevelScript::DoSetActorProperty (AActor *actor, int property, int value)
{
	if (actor == NULL)
	{
		return;
	}
	switch (property)
	{
	case APROP_Health:
		// Don't alter the health of dead things.
		if (actor->health <= 0 || (actor->player != NULL && actor->player->playerstate == PST_DEAD))
		{
			break;
		}
		actor->health = value;
		if (actor->player != NULL)
		{
			actor->player->health = value;
		}
		// If the health is set to a non-positive value, properly kill the actor.
		if (value <= 0)
		{
			actor->Die(activator, activator);
		}
		break;

	case APROP_Speed:
		actor->Speed = ACSToDouble(value);
		break;

	case APROP_Damage:
		actor->Damage = CreateDamageFunction(value);
		break;

	case APROP_Alpha:
		actor->Alpha = ACSToDouble(value);
		break;

	case APROP_RenderStyle:
		for(int i=0; LegacyRenderStyleIndices[i] >= 0; i++)
		{
			if (LegacyRenderStyleIndices[i] == value)
			{
				actor->RenderStyle = ERenderStyle(i);
				break;
			}
		}
		break;

	case APROP_Ambush:
		if (value) actor->flags |= MF_AMBUSH; else actor->flags &= ~MF_AMBUSH;
		break;

	case APROP_Dropped:
		if (value) actor->flags |= MF_DROPPED; else actor->flags &= ~MF_DROPPED;
		break;

	case APROP_Invulnerable:
		if (value) actor->flags2 |= MF2_INVULNERABLE; else actor->flags2 &= ~MF2_INVULNERABLE;
		break;

	case APROP_Notarget:
		if (value) actor->flags3 |= MF3_NOTARGET; else actor->flags3 &= ~MF3_NOTARGET;
		break;

	case APROP_Notrigger:
		if (value) actor->flags6 |= MF6_NOTRIGGER; else actor->flags6 &= ~MF6_NOTRIGGER;
		break;

	case APROP_JumpZ:
		if (actor->IsKindOf (RUNTIME_CLASS (APlayerPawn)))
			static_cast<APlayerPawn *>(actor)->JumpZ = ACSToDouble(value);
		break; 	// [GRB]

	case APROP_ChaseGoal:
		if (value)
			actor->flags5 |= MF5_CHASEGOAL;
		else
			actor->flags5 &= ~MF5_CHASEGOAL;
		break;

	case APROP_Frightened:
		if (value)
			actor->flags4 |= MF4_FRIGHTENED;
		else
			actor->flags4 &= ~MF4_FRIGHTENED;
		break;

	case APROP_Friendly:
		if (actor->CountsAsKill()) level.total_monsters--;
		if (value)
		{
			actor->flags |= MF_FRIENDLY;
		}
		else
		{
			actor->flags &= ~MF_FRIENDLY;
		}
		if (actor->CountsAsKill()) level.total_monsters++;
		break;


	case APROP_SpawnHealth:
		if (actor->IsKindOf (RUNTIME_CLASS (APlayerPawn)))
		{
			static_cast<APlayerPawn *>(actor)->MaxHealth = value;
		}
		break;

	case APROP_Gravity:
		actor->Gravity = ACSToDouble(value);
		break;

	case APROP_SeeSound:
		actor->SeeSound = FBehavior::StaticLookupString(value);
		break;

	case APROP_AttackSound:
		actor->AttackSound = FBehavior::StaticLookupString(value);
		break;

	case APROP_PainSound:
		actor->PainSound = FBehavior::StaticLookupString(value);
		break;

	case APROP_DeathSound:
		actor->DeathSound = FBehavior::StaticLookupString(value);
		break;

	case APROP_ActiveSound:
		actor->ActiveSound = FBehavior::StaticLookupString(value);
		break;

	case APROP_Species:
		actor->Species = FBehavior::StaticLookupString(value);
		break;

	case APROP_Score:
		actor->Score = value;
		break;

	case APROP_NameTag:
		actor->SetTag(FBehavior::StaticLookupString(value));
		break;

	case APROP_DamageFactor:
		actor->DamageFactor = ACSToDouble(value);
		break;

	case APROP_DamageMultiplier:
		actor->DamageMultiply = ACSToDouble(value);
		break;

	case APROP_MasterTID:
		AActor *other;
		other = SingleActorFromTID (value, NULL);
		DoSetMaster (actor, other);
		break;

	case APROP_ScaleX:
		actor->Scale.X = ACSToDouble(value);
		break;

	case APROP_ScaleY:
		actor->Scale.Y = ACSToDouble(value);
		break;

	case APROP_Mass:
		actor->Mass = value;
		break;

	case APROP_Accuracy:
		actor->accuracy = value;
		break;

	case APROP_Stamina:
		actor->stamina = value;
		break;

	case APROP_ReactionTime:
		actor->reactiontime = value;
		break;

	case APROP_MeleeRange:
		actor->meleerange = ACSToDouble(value);
		break;

	case APROP_ViewHeight:
		if (actor->IsKindOf (RUNTIME_CLASS (APlayerPawn)))
		{
			static_cast<APlayerPawn *>(actor)->ViewHeight = ACSToDouble(value);
			if (actor->player != NULL)
			{
				actor->player->viewheight = ACSToDouble(value);
			}
		}
		break;

	case APROP_AttackZOffset:
		if (actor->IsKindOf (RUNTIME_CLASS (APlayerPawn)))
			static_cast<APlayerPawn *>(actor)->AttackZOffset = ACSToDouble(value);
		break;

	case APROP_StencilColor:
		actor->SetShade(value);
		break;

	case APROP_Friction:
		actor->Friction = ACSToDouble(value);
		break;

	case APROP_MaxStepHeight:
		actor->MaxStepHeight = ACSToDouble(value);
		break;

	case APROP_MaxDropOffHeight:
		actor->MaxDropOffHeight = ACSToDouble(value);
		break;

	case APROP_DamageType:
		actor->DamageType = FBehavior::StaticLookupString(value);
		break;

	default:
		// do nothing.
		break;
	}
}